

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btok_cvc.c
# Opt level: O1

err_t btokCVCCheck(btok_cvc_t *cvc)

{
  ulong uVar1;
  bool_t bVar2;
  int iVar3;
  err_t eVar4;
  bign_params bStack_178;
  
  bVar2 = memIsValid(cvc,0x128);
  if (bVar2 == 0) {
    eVar4 = 0x6d;
  }
  else {
    bVar2 = btokCVCNameIsValid(cvc->authority);
    eVar4 = 0x135;
    if ((bVar2 != 0) && (bVar2 = btokCVCNameIsValid(cvc->holder), bVar2 != 0)) {
      bVar2 = tmDateIsValid2(cvc->from);
      eVar4 = 0x134;
      if (bVar2 != 0) {
        bVar2 = tmDateIsValid2(cvc->until);
        if ((bVar2 != 0) && (iVar3 = memCmp(cvc->from,cvc->until,6), iVar3 < 1)) {
          uVar1 = cvc->pubkey_len;
          eVar4 = 0x6d;
          if (((uVar1 & 1) == 0) && (eVar4 = btokParamsStd(&bStack_178,uVar1 >> 1), eVar4 == 0)) {
            if (uVar1 == 0x30) {
              eVar4 = bign96PubkeyVal(&bStack_178,cvc->pubkey);
            }
            else {
              eVar4 = bignPubkeyVal(&bStack_178,cvc->pubkey);
            }
          }
        }
      }
    }
  }
  return eVar4;
}

Assistant:

err_t btokCVCCheck(const btok_cvc_t* cvc)
{
	if (!memIsValid(cvc, sizeof(btok_cvc_t)))
		return ERR_BAD_INPUT;
	if (!btokCVCNameIsValid(cvc->authority) || !btokCVCNameIsValid(cvc->holder))
		return ERR_BAD_NAME;
	if (!tmDateIsValid2(cvc->from) || !tmDateIsValid2(cvc->until) ||
		!tmDateLeq2(cvc->from, cvc->until))
		return ERR_BAD_DATE;
	return btokPubkeyVal(cvc->pubkey, cvc->pubkey_len);
}